

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall QFutureInterfaceBase::suspendIfRequested(QFutureInterfaceBase *this)

{
  uint uVar1;
  QThreadPool *pool;
  QFutureInterfaceBasePrivate *pQVar2;
  long in_FS_OFFSET;
  ThreadPoolThreadReleaser releaser;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->d->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  if ((char)((uVar1 & 8) >> 3) == '\0' && (uVar1 & 0x30) != 0) {
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,&this->d->m_mutex);
    pQVar2 = this->d;
    uVar1 = (pQVar2->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i;
    if ((char)((uVar1 & 8) >> 3) == '\0' && (uVar1 & 0x30) != 0) {
      if ((uVar1 & 0x20) == 0) {
        switch_from_to(&pQVar2->state,0x10,0x20);
        pQVar2 = this->d;
        QFutureCallOutEvent::QFutureCallOutEvent((QFutureCallOutEvent *)&releaser,Suspended,-1);
        QFutureInterfaceBasePrivate::sendCallOut(pQVar2,(QFutureCallOutEvent *)&releaser);
        QFutureCallOutEvent::~QFutureCallOutEvent((QFutureCallOutEvent *)&releaser);
        pQVar2 = this->d;
      }
      releaser.m_pool = (QThreadPool *)&DAT_aaaaaaaaaaaaaaaa;
      pool = QFutureInterfaceBasePrivate::pool(pQVar2);
      anon_unknown.dwarf_1090f56::ThreadPoolThreadReleaser::ThreadPoolThreadReleaser(&releaser,pool)
      ;
      QWaitCondition::wait(&this->d->pausedWaitCondition,this->d);
      anon_unknown.dwarf_1090f56::ThreadPoolThreadReleaser::~ThreadPoolThreadReleaser(&releaser);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::suspendIfRequested()
{
    const auto canSuspend = [] (int state) {
        // can suspend only if 1) in any suspend-related state; 2) not canceled
        return (state & suspendingOrSuspended) && !(state & Canceled);
    };

    // return early if possible to avoid taking the mutex lock.
    {
        const int state = d->state.loadRelaxed();
        if (!canSuspend(state))
            return;
    }

    QMutexLocker lock(&d->m_mutex);
    const int state = d->state.loadRelaxed();
    if (!canSuspend(state))
        return;

    // Note: expecting that Suspending and Suspended are mutually exclusive
    if (!(state & Suspended)) {
        // switch state in case this is the first invocation
        switch_from_to(d->state, Suspending, Suspended);
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Suspended));
    }

    // decrease active thread count since this thread will wait.
    const ThreadPoolThreadReleaser releaser(d->pool());
    d->pausedWaitCondition.wait(&d->m_mutex);
}